

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minireflect.h
# Opt level: O1

void flatbuffers::IterateValue
               (ElementaryType type,uint8_t *val,TypeTable *type_table,uint8_t *prev_val,
               soffset_t vector_index,IterationVisitor *visitor)

{
  char *pcVar1;
  _func_int *UNRECOVERED_JUMPTABLE;
  ushort uVar2;
  uint tval;
  ulong uVar3;
  ulong uVar4;
  
  switch(type) {
  case ET_UTYPE:
    tval = (uint)*val;
    pcVar1 = EnumName<unsigned_char>(*val,type_table);
    UNRECOVERED_JUMPTABLE = visitor->_vptr_IterationVisitor[3];
    break;
  case ET_BOOL:
    (*visitor->_vptr_IterationVisitor[4])(visitor,(ulong)(*val != '\0'));
    return;
  case ET_CHAR:
    tval = (uint)(char)*val;
    pcVar1 = EnumName<signed_char>(*val,type_table);
    UNRECOVERED_JUMPTABLE = visitor->_vptr_IterationVisitor[5];
    break;
  case ET_UCHAR:
    tval = (uint)*val;
    pcVar1 = EnumName<unsigned_char>(*val,type_table);
    UNRECOVERED_JUMPTABLE = visitor->_vptr_IterationVisitor[6];
    break;
  case ET_SHORT:
    tval = (uint)*(short *)val;
    pcVar1 = EnumName<short>(*(short *)val,type_table);
    UNRECOVERED_JUMPTABLE = visitor->_vptr_IterationVisitor[7];
    break;
  case ET_USHORT:
    tval = (uint)*(ushort *)val;
    pcVar1 = EnumName<unsigned_short>(*(ushort *)val,type_table);
    UNRECOVERED_JUMPTABLE = visitor->_vptr_IterationVisitor[8];
    break;
  case ET_INT:
    tval = *(uint *)val;
    pcVar1 = EnumName<int>(tval,type_table);
    UNRECOVERED_JUMPTABLE = visitor->_vptr_IterationVisitor[9];
    break;
  case ET_UINT:
    tval = *(uint *)val;
    pcVar1 = EnumName<unsigned_int>(tval,type_table);
    UNRECOVERED_JUMPTABLE = visitor->_vptr_IterationVisitor[10];
    break;
  case ET_LONG:
    val = *(uint8_t **)val;
    UNRECOVERED_JUMPTABLE = visitor->_vptr_IterationVisitor[0xb];
    goto LAB_00193b8c;
  case ET_ULONG:
    val = *(uint8_t **)val;
    UNRECOVERED_JUMPTABLE = visitor->_vptr_IterationVisitor[0xc];
    goto LAB_00193b8c;
  case ET_FLOAT:
    uVar4 = (ulong)*(uint *)val;
    UNRECOVERED_JUMPTABLE = visitor->_vptr_IterationVisitor[0xd];
    goto LAB_00193ab6;
  case ET_DOUBLE:
    uVar4 = *(ulong *)val;
    UNRECOVERED_JUMPTABLE = visitor->_vptr_IterationVisitor[0xe];
LAB_00193ab6:
    (*UNRECOVERED_JUMPTABLE)(uVar4,visitor);
    return;
  case ET_STRING:
    val = val + *(uint *)val;
    UNRECOVERED_JUMPTABLE = visitor->_vptr_IterationVisitor[0xf];
    goto LAB_00193b8c;
  case ET_SEQUENCE:
    switch(type_table->st) {
    case ST_TABLE:
      val = val + *(uint *)val;
      break;
    case ST_STRUCT:
      break;
    case ST_UNION:
      if (prev_val == (uint8_t *)0x0) {
        __assert_fail("prev_val",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/include/flatbuffers/minireflect.h"
                      ,0xc2,
                      "void flatbuffers::IterateValue(ElementaryType, const uint8_t *, const TypeTable *, const uint8_t *, soffset_t, IterationVisitor *)"
                     );
      }
      if (-1 < vector_index) {
        if (*(uint *)prev_val <= (uint)vector_index) {
          __assert_fail("i < size()",
                        "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/include/flatbuffers/vector.h"
                        ,0xc1,
                        "return_type flatbuffers::Vector<unsigned char>::Get(SizeT) const [T = unsigned char, SizeT = unsigned int]"
                       );
        }
        prev_val = prev_val + (ulong)(uint)vector_index + 4;
      }
      uVar4 = type_table->num_elems;
      uVar3 = (ulong)*prev_val;
      if (type_table->values != (int64_t *)0x0) {
        if (uVar4 != 0) {
          uVar3 = 0;
          do {
            if (type_table->values[uVar3] == (ulong)*prev_val) goto LAB_00193b3e;
            uVar3 = uVar3 + 1;
          } while (uVar4 != uVar3);
        }
        uVar3 = 0xffffffffffffffff;
      }
LAB_00193b3e:
      val = val + *(uint *)val;
      if ((-1 < (long)uVar3) && ((long)uVar3 < (long)(int)uVar4)) {
        uVar2 = (ushort)type_table->type_codes[uVar3] & 0xf;
        if (uVar2 == 0xc) {
          UNRECOVERED_JUMPTABLE = visitor->_vptr_IterationVisitor[0xf];
          goto LAB_00193b8c;
        }
        if (uVar2 == 0xd) {
          type_table = (*type_table->type_refs
                         [(short)((uint)(int)(short)type_table->type_codes[uVar3] >> 5)])();
          break;
        }
      }
      goto switchD_0019397e_default;
    case ST_ENUM:
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/include/flatbuffers/minireflect.h"
                    ,0xdd,
                    "void flatbuffers::IterateValue(ElementaryType, const uint8_t *, const TypeTable *, const uint8_t *, soffset_t, IterationVisitor *)"
                   );
    default:
      return;
    }
    IterateObject(val,type_table,visitor);
    return;
  default:
switchD_0019397e_default:
    UNRECOVERED_JUMPTABLE = visitor->_vptr_IterationVisitor[0x10];
LAB_00193b8c:
    (*UNRECOVERED_JUMPTABLE)(visitor,val);
    return;
  }
  (*UNRECOVERED_JUMPTABLE)(visitor,(ulong)tval,pcVar1,UNRECOVERED_JUMPTABLE);
  return;
}

Assistant:

inline void IterateValue(ElementaryType type, const uint8_t *val,
                         const TypeTable *type_table, const uint8_t *prev_val,
                         soffset_t vector_index, IterationVisitor *visitor) {
  switch (type) {
    case ET_UTYPE: {
      auto tval = ReadScalar<uint8_t>(val);
      visitor->UType(tval, EnumName(tval, type_table));
      break;
    }
    case ET_BOOL: {
      visitor->Bool(ReadScalar<uint8_t>(val) != 0);
      break;
    }
    case ET_CHAR: {
      auto tval = ReadScalar<int8_t>(val);
      visitor->Char(tval, EnumName(tval, type_table));
      break;
    }
    case ET_UCHAR: {
      auto tval = ReadScalar<uint8_t>(val);
      visitor->UChar(tval, EnumName(tval, type_table));
      break;
    }
    case ET_SHORT: {
      auto tval = ReadScalar<int16_t>(val);
      visitor->Short(tval, EnumName(tval, type_table));
      break;
    }
    case ET_USHORT: {
      auto tval = ReadScalar<uint16_t>(val);
      visitor->UShort(tval, EnumName(tval, type_table));
      break;
    }
    case ET_INT: {
      auto tval = ReadScalar<int32_t>(val);
      visitor->Int(tval, EnumName(tval, type_table));
      break;
    }
    case ET_UINT: {
      auto tval = ReadScalar<uint32_t>(val);
      visitor->UInt(tval, EnumName(tval, type_table));
      break;
    }
    case ET_LONG: {
      visitor->Long(ReadScalar<int64_t>(val));
      break;
    }
    case ET_ULONG: {
      visitor->ULong(ReadScalar<uint64_t>(val));
      break;
    }
    case ET_FLOAT: {
      visitor->Float(ReadScalar<float>(val));
      break;
    }
    case ET_DOUBLE: {
      visitor->Double(ReadScalar<double>(val));
      break;
    }
    case ET_STRING: {
      val += ReadScalar<uoffset_t>(val);
      visitor->String(reinterpret_cast<const String *>(val));
      break;
    }
    case ET_SEQUENCE: {
      switch (type_table->st) {
        case ST_TABLE:
          val += ReadScalar<uoffset_t>(val);
          IterateObject(val, type_table, visitor);
          break;
        case ST_STRUCT: IterateObject(val, type_table, visitor); break;
        case ST_UNION: {
          val += ReadScalar<uoffset_t>(val);
          FLATBUFFERS_ASSERT(prev_val);
          auto union_type = *prev_val;  // Always a uint8_t.
          if (vector_index >= 0) {
            auto type_vec = reinterpret_cast<const Vector<uint8_t> *>(prev_val);
            union_type = type_vec->Get(static_cast<uoffset_t>(vector_index));
          }
          auto type_code_idx =
              LookupEnum(union_type, type_table->values, type_table->num_elems);
          if (type_code_idx >= 0 &&
              type_code_idx < static_cast<int32_t>(type_table->num_elems)) {
            auto type_code = type_table->type_codes[type_code_idx];
            switch (type_code.base_type) {
              case ET_SEQUENCE: {
                auto ref = type_table->type_refs[type_code.sequence_ref]();
                IterateObject(val, ref, visitor);
                break;
              }
              case ET_STRING:
                visitor->String(reinterpret_cast<const String *>(val));
                break;
              default: visitor->Unknown(val);
            }
          } else {
            visitor->Unknown(val);
          }
          break;
        }
        case ST_ENUM: FLATBUFFERS_ASSERT(false); break;
      }
      break;
    }
    default: {
      visitor->Unknown(val);
      break;
    }
  }
}